

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

uint64_t wasm::getSeed(void)

{
  result_type rVar1;
  uniform_int_distribution<unsigned_long> local_13a0;
  undefined1 local_1390 [8];
  random_device rand;
  
  std::random_device::random_device((random_device *)local_1390);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution(&local_13a0);
  rVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_13a0,(random_device *)local_1390);
  std::random_device::~random_device((random_device *)local_1390);
  return rVar1;
}

Assistant:

uint64_t getSeed() {
  // Return a (truly) random 64-bit value.
  std::random_device rand;
  return std::uniform_int_distribution<uint64_t>{}(rand);
}